

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_classes.cpp
# Opt level: O3

void test_classes(void)

{
  int iVar1;
  duk_idx_t dVar2;
  duk_context *ctx;
  Dog *pDVar3;
  string *psVar4;
  undefined8 uVar5;
  ulong uVar6;
  initializer_list<Dog_*> __l;
  vector<Dog_*,_std::allocator<Dog_*>_> dogs;
  allocator_type local_c1;
  vector<Dog_*,_std::allocator<Dog_*>_> local_c0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  Dog *local_48;
  string *local_40;
  string *local_38;
  
  ctx = duk_create_heap((duk_alloc_function)0x0,(duk_realloc_function)0x0,(duk_free_function)0x0,
                        (void *)0x0,(duk_fatal_function)0x0);
  dukglue_register_constructor<Dog,std::__cxx11::string_const&>(ctx,"Dog");
  dukglue_register_method<true,Dog,std::__cxx11::string_const&>(ctx,0x117b6a,(char *)0x0);
  dukglue_register_method<false,Dog,void,std::__cxx11::string_const&>(ctx,0x117b6e,(char *)0x0);
  dukglue_register_method<false,Dog,void,bool>(ctx,0x117a5e,(char *)0x0);
  dukglue_register_method<false,Dog,int>(ctx,0x117b74,(char *)0x0);
  test_eval(ctx,"var test = new Dog(\'Gus\');");
  duk_pop(ctx);
  test_eval_expect(ctx,"test.getName();","Gus");
  test_eval(ctx,"test.rename(\'Archie\');");
  duk_pop(ctx);
  test_eval_expect(ctx,"test.getName();","Archie");
  dukglue_register_function<void,Dog*>(ctx,pokeWithStick,"pokeWithStick");
  test_eval(ctx,"pokeWithStick(test);");
  duk_pop(ctx);
  test_eval_expect(ctx,"test.getBarkCount();",1);
  dukglue_register_constructor<Goat>(ctx,"Goat");
  dukglue_register_delete<Goat>(ctx);
  test_eval(ctx,"var goat = new Goat();");
  duk_pop(ctx);
  test_eval_expect_error(ctx,"pokeWithStick(goat);");
  test_eval(ctx,"goat.delete()");
  duk_pop(ctx);
  dukglue_register_function<Dog*>(ctx,visitPuppy,"visitPuppy");
  test_eval(ctx,"var puppy = visitPuppy();");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.getName()","Sammie");
  test_eval(ctx,"pokeWithStick(puppy);");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.getBarkCount()",1);
  pDVar3 = visitPuppy();
  test_assert(pDVar3->bark_count_ == 1);
  test_eval(ctx,"puppy.dynamicfield = 4;");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.dynamicfield",4);
  test_eval(ctx,"puppy = null; puppy = visitPuppy();");
  duk_pop(ctx);
  test_eval_expect(ctx,"puppy.dynamicfield",4);
  dukglue_register_delete<Dog>(ctx);
  test_eval(ctx,"var myPuppy = new Dog(\'Squirt\');");
  test_eval(ctx,"pokeWithStick(myPuppy);");
  test_eval(ctx,"myPuppy.delete();");
  duk_pop_3(ctx);
  test_eval_expect_error(ctx,"myPuppy.bark();");
  test_eval_expect_error(ctx,"pokeWithStick(myPuppy);");
  test_eval_expect_error(ctx,"myPuppy.delete();");
  test_eval(ctx,"test.delete()");
  duk_pop(ctx);
  pDVar3 = (Dog *)operator_new(0x28);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Gus","");
  (pDVar3->name_)._M_dataplus._M_p = (pointer)&(pDVar3->name_).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pDVar3,local_88,local_80 + (long)local_88);
  pDVar3->bark_count_ = 0;
  local_48 = pDVar3;
  psVar4 = (string *)operator_new(0x28);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Sammy","");
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,local_68,local_60 + (long)local_68);
  *(undefined4 *)(psVar4 + 0x20) = 0;
  local_40 = psVar4;
  psVar4 = (string *)operator_new(0x28);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Zoey","");
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,local_a8,local_a0 + (long)local_a8);
  *(undefined4 *)(psVar4 + 0x20) = 0;
  __l._M_len = 3;
  __l._M_array = &local_48;
  local_38 = psVar4;
  std::vector<Dog_*,_std::allocator<Dog_*>_>::vector(&local_c0,__l,&local_c1);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
  push<std::vector<Dog*,std::allocator<Dog*>>>(ctx,&local_c0);
  if (local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  dukglue_read<std::vector<Dog*,std::allocator<Dog*>>>(ctx,-1,&local_c0);
  duk_pop(ctx);
  test_assert((long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x18);
  if (local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    iVar1 = std::__cxx11::string::compare
                      ((char *)*local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
    test_assert(iVar1 == 0);
    uVar6 = (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar6 < 2) {
      uVar5 = 1;
      goto LAB_001176c7;
    }
    iVar1 = std::__cxx11::string::compare
                      ((char *)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                               super__Vector_impl_data._M_start[1]);
    test_assert(iVar1 == 0);
    uVar6 = (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar6 < 3) {
      uVar5 = 2;
      goto LAB_001176c7;
    }
    iVar1 = std::__cxx11::string::compare
                      ((char *)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                               super__Vector_impl_data._M_start[2]);
    test_assert(iVar1 == 0);
    uVar6 = 0;
    while (uVar6 < (ulong)((long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3)) {
      pDVar3 = local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      if (pDVar3 != (Dog *)0x0) {
        Dog::~Dog(pDVar3);
      }
      operator_delete(pDVar3,0x28);
      uVar6 = uVar6 + 1;
      if (uVar6 == 3) {
        if (local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c0.super__Vector_base<Dog_*,_std::allocator<Dog_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        dVar2 = duk_get_top(ctx);
        test_assert(dVar2 == 0);
        duk_destroy_heap(ctx);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Classes tested OK",0x11);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        return;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
  }
  uVar5 = 0;
  uVar6 = 0;
LAB_001176c7:
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5,uVar6);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void test_classes() {
	duk_context* ctx = duk_create_heap_default();

	// - dukglue_register_constructor with arguments
	// - dukglue_register_method (const and non-const)
	dukglue_register_constructor<Dog, const std::string&>(ctx, "Dog");
	dukglue_register_method(ctx, &Dog::getName, "getName");  // const method
	dukglue_register_method(ctx, &Dog::rename, "rename");
	dukglue_register_method(ctx, &Dog::bark, "bark");
	dukglue_register_method(ctx, &Dog::getBarkCount, "getBarkCount");

	// - test that script can actually call constructor + methods
	test_eval(ctx, "var test = new Dog('Gus');");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getName();", "Gus");
	test_eval(ctx, "test.rename('Archie');");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getName();", "Archie");

	// - test native objects as arguments to native functions
	dukglue_register_function(ctx, pokeWithStick, "pokeWithStick");
	test_eval(ctx, "pokeWithStick(test);");
	duk_pop(ctx);
	test_eval_expect(ctx, "test.getBarkCount();", 1);

	// - test type-safety when passing native types
	dukglue_register_constructor<Goat>(ctx, "Goat");
	dukglue_register_delete<Goat>(ctx);
	test_eval(ctx, "var goat = new Goat();");
	duk_pop(ctx);
	test_eval_expect_error(ctx, "pokeWithStick(goat);");
	test_eval(ctx, "goat.delete()");
	duk_pop(ctx);

	// - test that objects can be passed from C++ to script correctly
	dukglue_register_function(ctx, visitPuppy, "visitPuppy");
	test_eval(ctx, "var puppy = visitPuppy();");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.getName()", "Sammie");
	test_eval(ctx, "pokeWithStick(puppy);");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.getBarkCount()", 1);
	test_assert(visitPuppy()->getBarkCount() == 1);

	// - test that dynamic fields persist when passing the same native object twice
	test_eval(ctx, "puppy.dynamicfield = 4;");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.dynamicfield", 4);
	test_eval(ctx, "puppy = null; puppy = visitPuppy();");
	duk_pop(ctx);
	test_eval_expect(ctx, "puppy.dynamicfield", 4);

	// - test that references are properly invalidated by obj.delete()
	dukglue_register_delete<Dog>(ctx);
	test_eval(ctx, "var myPuppy = new Dog('Squirt');");
	test_eval(ctx, "pokeWithStick(myPuppy);");
	test_eval(ctx, "myPuppy.delete();");
	duk_pop_3(ctx);
	test_eval_expect_error(ctx, "myPuppy.bark();");
	test_eval_expect_error(ctx, "pokeWithStick(myPuppy);");
	test_eval_expect_error(ctx, "myPuppy.delete();");
	test_eval(ctx, "test.delete()");
	duk_pop(ctx);

	// std::vector<Cls*>
	{
		std::vector<Dog*> dogs = { new Dog("Gus"), new Dog("Sammy"), new Dog("Zoey") };
		dukglue_push(ctx, dogs);

		dogs.clear();
		dukglue_read(ctx, -1, &dogs);
		duk_pop(ctx);

		test_assert(dogs.size() == 3);
		test_assert(dogs.at(0)->getName() == "Gus");
		test_assert(dogs.at(1)->getName() == "Sammy");
		test_assert(dogs.at(2)->getName() == "Zoey");

		for (unsigned int i = 0; i < 3; i++)
			delete dogs.at(i);
	}

	test_assert(duk_get_top(ctx) == 0);
	duk_destroy_heap(ctx);

	std::cout << "Classes tested OK" << std::endl;
}